

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_lex.c
# Opt level: O0

void easm_restart(FILE *input_file,yyscan_t yyscanner)

{
  YY_BUFFER_STATE pyVar1;
  YY_BUFFER_STATE local_28;
  yyguts_t *yyg;
  yyscan_t yyscanner_local;
  FILE *input_file_local;
  
  if ((*(long *)((long)yyscanner + 0x38) == 0) ||
     (*(long *)(*(long *)((long)yyscanner + 0x38) + *(long *)((long)yyscanner + 0x28) * 8) == 0)) {
    easm_ensure_buffer_stack(yyscanner);
    pyVar1 = easm__create_buffer(*(FILE **)((long)yyscanner + 0x18),0x4000,yyscanner);
    *(YY_BUFFER_STATE *)(*(long *)((long)yyscanner + 0x38) + *(long *)((long)yyscanner + 0x28) * 8)
         = pyVar1;
  }
  if (*(long *)((long)yyscanner + 0x38) == 0) {
    local_28 = (YY_BUFFER_STATE)0x0;
  }
  else {
    local_28 = *(YY_BUFFER_STATE *)
                (*(long *)((long)yyscanner + 0x38) + *(long *)((long)yyscanner + 0x28) * 8);
  }
  easm__init_buffer(local_28,input_file,yyscanner);
  easm__load_buffer_state(yyscanner);
  return;
}

Assistant:

void yyrestart  (FILE * input_file , yyscan_t yyscanner)
{
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;

	if ( ! YY_CURRENT_BUFFER ){
        yyensure_buffer_stack (yyscanner);
		YY_CURRENT_BUFFER_LVALUE =
            yy_create_buffer( yyin, YY_BUF_SIZE , yyscanner);
	}

	yy_init_buffer( YY_CURRENT_BUFFER, input_file , yyscanner);
	yy_load_buffer_state( yyscanner );
}